

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::FunctionalTest::calculateDimmensions
          (FunctionalTest *this,GLenum target,GLuint level,GLuint width,GLuint height,
          GLuint *out_widths,GLuint *out_heights,GLuint *out_depths)

{
  bool bVar1;
  GLuint GVar2;
  uint local_50;
  uint local_4c;
  GLuint i_2;
  GLuint i_1;
  GLint i;
  GLuint n_layers;
  bool is_multi_layer;
  GLuint factor;
  GLuint factors [3];
  GLuint divide;
  GLuint *out_widths_local;
  GLuint height_local;
  GLuint width_local;
  GLuint level_local;
  GLenum target_local;
  FunctionalTest *this_local;
  
  factors[1] = 100;
  n_layers = 100;
  unique0x10000135 = out_widths;
  bVar1 = Utils::isTargetMultilayer(target);
  GVar2 = 1;
  i_2 = level;
  if (bVar1) {
    GVar2 = 0xc;
  }
  for (; -1 < (int)i_2; i_2 = i_2 - 1) {
    *(GLuint *)(&stack0xffffffffffffffc8 + (long)(int)i_2 * 4) = n_layers;
    n_layers = n_layers << 1;
  }
  n_layers = factors[1];
  for (local_4c = level + 1; n_layers = n_layers >> 1, local_4c < 3; local_4c = local_4c + 1) {
    *(GLuint *)(&stack0xffffffffffffffc8 + (ulong)local_4c * 4) = n_layers;
  }
  for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
    stack0xffffffffffffffd8[local_50] =
         (width * *(int *)(&stack0xffffffffffffffc8 + (ulong)local_50 * 4)) / factors[1];
    out_heights[local_50] =
         (height * *(int *)(&stack0xffffffffffffffc8 + (ulong)local_50 * 4)) / factors[1];
    if (target == 0x806f) {
      out_depths[local_50] =
           (uint)(*(int *)(&stack0xffffffffffffffc8 + (ulong)local_50 * 4) * 0xc) / factors[1];
    }
    else {
      out_depths[local_50] = GVar2;
    }
  }
  return;
}

Assistant:

void FunctionalTest::calculateDimmensions(GLenum target, GLuint level, GLuint width, GLuint height, GLuint* out_widths,
										  GLuint* out_heights, GLuint* out_depths) const
{
	GLuint		 divide = 100;
	GLuint		 factors[FUNCTIONAL_TEST_N_LEVELS];
	GLuint		 factor			= divide;
	const bool   is_multi_layer = Utils::isTargetMultilayer(target);
	const GLuint n_layers		= (true == is_multi_layer) ? FUNCTIONAL_TEST_N_LAYERS : 1;

	for (GLint i = (GLint)level; i >= 0; --i)
	{
		factors[i] = factor;
		factor *= 2;
	}

	factor = divide / 2;
	for (GLuint i = level + 1; i < FUNCTIONAL_TEST_N_LEVELS; ++i)
	{
		factors[i] = factor;
		factor /= 2;
	}

	for (GLuint i = 0; i < FUNCTIONAL_TEST_N_LEVELS; ++i)
	{
		out_widths[i]  = width * factors[i] / divide;
		out_heights[i] = height * factors[i] / divide;

		if (GL_TEXTURE_3D == target)
		{
			out_depths[i] = FUNCTIONAL_TEST_N_LAYERS * factors[i] / divide;
		}
		else
		{
			out_depths[i] = n_layers;
		}
	}
}